

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation.cpp
# Opt level: O1

void __thiscall indigox::ElectronOpt::SortPotentialLocations(ElectronOpt *this)

{
  undefined8 *puVar1;
  undefined1 uVar2;
  char cVar3;
  byte bVar4;
  MolVertPair *pMVar5;
  void *pvVar6;
  void *pvVar7;
  pointer ppVar8;
  undefined8 uVar9;
  ElnVertProp **ppEVar10;
  ElnVertProp **ppEVar11;
  StoredVertex *sv;
  ElnVertex pvVar12;
  long lVar13;
  ElnVertProp **ppEVar14;
  uint uVar15;
  ulong uVar16;
  MolVertPair *vp;
  MolVertPair *pMVar17;
  pair<indigox::ElnVertProp_**,_long> pVar18;
  ElnVertProp *p;
  vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_> sortedUniques;
  ElnVertProp *local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_> local_48;
  
  local_48.super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (ElnVertProp **)0x0;
  local_48.super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ElnVertProp **)0x0;
  local_48.super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (ElnVertProp **)0x0;
  std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>::reserve
            (&local_48,
             (long)(this->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  pMVar17 = (this->possibleLocations_).
            super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (this->possibleLocations_).
           super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppEVar10 = local_48.
             super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar11 = local_48.
             super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  do {
    local_48.super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
    _M_impl.super__Vector_impl_data._M_start = ppEVar10;
    local_48.super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppEVar11;
    if (pMVar17 == pMVar5) {
      if (ppEVar10 != ppEVar11) {
        lVar13 = (long)ppEVar11 - (long)ppEVar10 >> 3;
        pVar18 = std::get_temporary_buffer<indigox::ElnVertProp*>
                           ((lVar13 - (lVar13 + 1 >> 0x3f)) + 1 >> 1);
        lVar13 = pVar18.second;
        ppEVar14 = pVar18.first;
        if (ppEVar14 == (ElnVertProp **)0x0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<indigox::ElnVertProp**,std::vector<indigox::ElnVertProp*,std::allocator<indigox::ElnVertProp*>>>,__gnu_cxx::__ops::_Iter_comp_iter<indigox::ElectronOpt::SortPotentialLocations()::__0>>
                    (ppEVar10,ppEVar11);
          lVar13 = 0;
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<indigox::ElnVertProp**,std::vector<indigox::ElnVertProp*,std::allocator<indigox::ElnVertProp*>>>,indigox::ElnVertProp**,long,__gnu_cxx::__ops::_Iter_comp_iter<indigox::ElectronOpt::SortPotentialLocations()::__0>>
                    (ppEVar10,ppEVar11,ppEVar14,lVar13);
        }
        operator_delete(ppEVar14,lVar13 << 3);
      }
      if ((long)local_48.
                super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_48.
                super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        ppVar8 = (this->possibleLocations_).
                 super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar15 = 1;
        lVar13 = 0;
        do {
          uVar9 = (*(undefined8 **)
                    ((long)local_48.
                           super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar13))[1];
          puVar1 = (undefined8 *)((long)&ppVar8->first + lVar13 * 2);
          *puVar1 = **(undefined8 **)
                      ((long)local_48.
                             super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar13);
          puVar1[1] = uVar9;
          uVar16 = (ulong)uVar15;
          lVar13 = lVar13 + 8;
          uVar15 = uVar15 + 1;
        } while (uVar16 < (ulong)((long)local_48.
                                        super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_48.
                                        super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      if (local_48.
          super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (ElnVertProp **)0x0) {
        operator_delete(local_48.
                        super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    pvVar12 = ElectronGraph::GetVertex
                        ((this->elnGraph_).
                         super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,*pMVar17);
    local_60 = (ElnVertProp *)((long)pvVar12 + 0x30);
    pvVar6 = pMVar17->first;
    pvVar7 = pMVar17->second;
    if (pvVar6 == pvVar7) {
      Atom::GetElement(*(Atom **)((long)pvVar6 + 0x30));
      cVar3 = *(char *)(local_58 + 0x42);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      switch(cVar3) {
      case '\a':
        lVar13 = *(long *)((long)pMVar17->first + 0x28);
        if (lVar13 == 3) {
          local_60->sort_score = N_THREE;
        }
        else if (lVar13 == 2) {
          local_60->sort_score = N_TWO;
        }
        else {
          if (lVar13 != 1) goto LAB_001153dc;
          local_60->sort_score = N_ONE;
        }
        break;
      case '\b':
        lVar13 = *(long *)((long)pMVar17->first + 0x28);
        if (lVar13 == 2) {
          local_60->sort_score = O_TWO;
        }
        else {
          if (lVar13 != 1) goto LAB_001153dc;
          local_60->sort_score = O_ONE;
        }
        break;
      case '\t':
        if (*(long *)((long)pMVar17->first + 0x28) == 1) {
          local_60->sort_score = F_ONE;
          break;
        }
        goto LAB_001153dc;
      case '\n':
      case '\v':
      case '\f':
      case '\r':
      case '\x0e':
        goto switchD_00114e29_caseD_9;
      case '\x0f':
        lVar13 = *(long *)((long)pMVar17->first + 0x28);
        if (lVar13 == 3) {
          local_60->sort_score = P_THREE;
        }
        else if (lVar13 == 2) {
          local_60->sort_score = P_TWO;
        }
        else {
          if (lVar13 != 1) goto LAB_001153dc;
          local_60->sort_score = P_ONE;
        }
        break;
      case '\x10':
        lVar13 = *(long *)((long)pMVar17->first + 0x28);
        if ((lVar13 != 2) && (lVar13 != 1)) goto LAB_001153dc;
        local_60->sort_score = S_ONE;
        break;
      case '\x11':
        if (*(long *)((long)pMVar17->first + 0x28) != 1) goto LAB_001153dc;
        local_60->sort_score = CL_ONE;
        break;
      default:
        if (cVar3 != '#') goto switchD_00114e29_caseD_9;
        if (*(long *)((long)pMVar17->first + 0x28) != 1) goto LAB_001153dc;
        local_60->sort_score = BR_ONE;
      }
      goto LAB_001153e3;
    }
    Atom::GetElement(*(Atom **)((long)pvVar6 + 0x30));
    uVar2 = *(undefined1 *)(local_58 + 0x42);
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    switch(uVar2) {
    case 6:
      Atom::GetElement(*(Atom **)((long)pvVar7 + 0x30));
      bVar4 = *(byte *)(local_58 + 0x42);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      if (bVar4 < 8) {
        if (bVar4 == 6) {
          lVar13 = *(long *)((long)pMVar17->first + 0x28);
          if (lVar13 == 3) {
            if (*(long *)((long)pMVar17->second + 0x28) != 3) break;
            local_60->sort_score = C_THREE_C_THREE;
          }
          else {
            if ((lVar13 != 2) || (*(long *)((long)pMVar17->second + 0x28) != 2)) break;
            local_60->sort_score = C_TWO_C_TWO;
          }
          goto LAB_001153e3;
        }
        if (bVar4 == 7) {
          lVar13 = *(long *)((long)pMVar17->first + 0x28);
          if (lVar13 == 3) {
            if (*(long *)((long)pMVar17->second + 0x28) == 2) goto LAB_001153aa;
          }
          else if ((lVar13 == 2) && (*(long *)((long)pMVar17->second + 0x28) == 1))
          goto LAB_001152a5;
        }
      }
      else if (bVar4 == 8) {
        if ((*(long *)((long)pMVar17->first + 0x28) == 3) &&
           (*(long *)((long)pMVar17->second + 0x28) == 1)) {
LAB_0011535e:
          local_60->sort_score = C_THREE_O_ONE;
          goto LAB_001153e3;
        }
      }
      else if (((bVar4 == 0x10) && (*(long *)((long)pMVar17->first + 0x28) == 3)) &&
              (*(long *)((long)pMVar17->second + 0x28) == 1)) goto LAB_0011523a;
      break;
    case 7:
      Atom::GetElement(*(Atom **)((long)pvVar7 + 0x30));
      cVar3 = *(char *)(local_58 + 0x42);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      if (cVar3 == '\x06') {
        lVar13 = *(long *)((long)pMVar17->first + 0x28);
        if (lVar13 == 2) {
          if (*(long *)((long)pMVar17->second + 0x28) != 3) break;
LAB_001153aa:
          local_60->sort_score = C_THREE_N_TWO;
        }
        else {
          if ((lVar13 != 1) || (*(long *)((long)pMVar17->second + 0x28) != 2)) break;
LAB_001152a5:
          local_60->sort_score = C_TWO_N_ONE;
        }
      }
      else if (cVar3 == '\a') {
        if ((*(long *)((long)pMVar17->first + 0x28) != 2) ||
           (*(long *)((long)pMVar17->second + 0x28) != 2)) break;
        local_60->sort_score = N_TWO_N_TWO;
      }
      else {
        if (((cVar3 != '\b') || (*(long *)((long)pMVar17->first + 0x28) != 3)) ||
           (*(long *)((long)pMVar17->second + 0x28) != 1)) break;
LAB_00114ff0:
        local_60->sort_score = N_THREE_O_ONE;
      }
      goto LAB_001153e3;
    case 8:
      Atom::GetElement(*(Atom **)((long)pvVar7 + 0x30));
      bVar4 = *(byte *)(local_58 + 0x42);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      if (bVar4 < 0xf) {
        if (bVar4 == 6) {
          if ((*(long *)((long)pMVar17->first + 0x28) == 1) &&
             (*(long *)((long)pMVar17->second + 0x28) == 3)) goto LAB_0011535e;
        }
        else if ((bVar4 == 7) &&
                ((*(long *)((long)pMVar17->first + 0x28) == 1 &&
                 (*(long *)((long)pMVar17->second + 0x28) == 3)))) goto LAB_00114ff0;
      }
      else if (bVar4 == 0xf) {
        if ((*(long *)((long)pMVar17->first + 0x28) == 1) &&
           (*(long *)((long)pMVar17->second + 0x28) == 4)) goto LAB_001152f7;
      }
      else if (((bVar4 == 0x10) && (*(long *)((long)pMVar17->first + 0x28) == 1)) &&
              (*(long *)((long)pMVar17->second + 0x28) == 4)) goto LAB_00115107;
      break;
    case 0xf:
      Atom::GetElement(*(Atom **)((long)pvVar7 + 0x30));
      cVar3 = *(char *)(local_58 + 0x42);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      if (((cVar3 == '\b') && (*(long *)((long)pMVar17->first + 0x28) == 4)) &&
         (*(long *)((long)pMVar17->second + 0x28) == 1)) {
LAB_001152f7:
        local_60->sort_score = O_ONE_P_FOUR;
        goto LAB_001153e3;
      }
      break;
    case 0x10:
      Atom::GetElement(*(Atom **)((long)pvVar7 + 0x30));
      cVar3 = *(char *)(local_58 + 0x42);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      if (cVar3 == '\x06') {
        if ((*(long *)((long)pMVar17->first + 0x28) != 1) ||
           (*(long *)((long)pMVar17->second + 0x28) != 3)) break;
LAB_0011523a:
        local_60->sort_score = C_THREE_S_ONE;
      }
      else {
        if ((cVar3 != '\b') ||
           ((*(long *)((long)pMVar17->first + 0x28) != 4 ||
            (*(long *)((long)pMVar17->second + 0x28) != 1)))) break;
LAB_00115107:
        local_60->sort_score = O_ONE_S_FOUR;
      }
      goto LAB_001153e3;
    }
switchD_00114e29_caseD_9:
LAB_001153dc:
    local_60->sort_score = UNDEFINED;
LAB_001153e3:
    if (local_48.super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_48.super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<indigox::ElnVertProp*,std::allocator<indigox::ElnVertProp*>>::
      _M_realloc_insert<indigox::ElnVertProp*const&>
                ((vector<indigox::ElnVertProp*,std::allocator<indigox::ElnVertProp*>> *)&local_48,
                 (iterator)
                 local_48.
                 super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_60);
    }
    else {
      *local_48.super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
       _M_impl.super__Vector_impl_data._M_finish = local_60;
      local_48.super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_48.
           super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pMVar17 = pMVar17 + 1;
    ppEVar10 = local_48.
               super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppEVar11 = local_48.
               super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

void ElectronOpt::SortPotentialLocations() {
  std::vector<ElnVertProp*> sortedUniques;
  sortedUniques.reserve(possibleLocations_.size());
  for (MolVertPair& vp : possibleLocations_) {
    ElnVertProp* p = elnGraph_->GetProperties(elnGraph_->GetVertex(vp));
    if (vp.first == vp.second) {
      MolVertProp* prop = molGraph_->GetProperties(vp.first);
      switch (prop->atom->GetElement()->GetAtomicNumber()) {
        case 7:  // Nitrogen
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::N_ONE; break;
            case 2: p->sort_score = SortOrder::N_TWO; break;
            case 3: p->sort_score = SortOrder::N_THREE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 8:  // Oxygen
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::O_ONE; break;
            case 2: p->sort_score = SortOrder::O_TWO; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 9:  // Fluorine
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::F_ONE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 15:  // Phosphorus
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::P_ONE; break;
            case 2: p->sort_score = SortOrder::P_TWO; break;
            case 3: p->sort_score = SortOrder::P_THREE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 16:  // Sulfur
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::S_ONE; break;
            case 2: p->sort_score = SortOrder::S_ONE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 17:  // Chlorine
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::CL_ONE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 35:
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::BR_ONE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        default: p->sort_score = SortOrder::UNDEFINED; break;
      }
    } else {
      MolVertProp* propa = molGraph_->GetProperties(vp.first);
      MolVertProp* propb = molGraph_->GetProperties(vp.second);
      switch (propa->atom->GetElement()->GetAtomicNumber()) {
        case 6:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 6:
              if (molGraph_->Degree(vp.first) == 2
                  && molGraph_->Degree(vp.second) == 2)
                p->sort_score = SortOrder::C_TWO_C_TWO;
              else if (molGraph_->Degree(vp.first) == 3
                    && molGraph_->Degree(vp.second) == 3)
                  p->sort_score = SortOrder::C_THREE_C_THREE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 7:
              if (molGraph_->Degree(vp.first) == 2
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::C_TWO_N_ONE;
              else if (molGraph_->Degree(vp.first) == 3
                       && molGraph_->Degree(vp.second) == 2)
                p->sort_score = SortOrder::C_THREE_N_TWO;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 8:
              if (molGraph_->Degree(vp.first) == 3
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::C_THREE_O_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 16:
              if (molGraph_->Degree(vp.first) == 3
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::C_THREE_S_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 7:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 6:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 2)
                p->sort_score = SortOrder::C_TWO_N_ONE;
              else if (molGraph_->Degree(vp.first) == 2
                       && molGraph_->Degree(vp.second) == 3)
                p->sort_score = SortOrder::C_THREE_N_TWO;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 7:
              if (molGraph_->Degree(vp.first) == 2
                  && molGraph_->Degree(vp.second) == 2)
                p->sort_score = SortOrder::N_TWO_N_TWO;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 8:
              if (molGraph_->Degree(vp.first) == 3
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::N_THREE_O_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 8:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 6:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 3)
                p->sort_score = SortOrder::C_THREE_O_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 7:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 3)
                p->sort_score = SortOrder::N_THREE_O_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 15:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 4)
                p->sort_score = SortOrder::O_ONE_P_FOUR;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 16:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 4)
                p->sort_score = SortOrder::O_ONE_S_FOUR;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 15:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 8:
              if (molGraph_->Degree(vp.first) == 4
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::O_ONE_P_FOUR;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 16:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 6:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 3)
                p->sort_score = SortOrder::C_THREE_S_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 8:
              if (molGraph_->Degree(vp.first) == 4
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::O_ONE_S_FOUR;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        default: p->sort_score = SortOrder::UNDEFINED; break;
      }
    }
    
    sortedUniques.push_back(p);
  }
  std::stable_sort(sortedUniques.begin(), sortedUniques.end(),
                   [](const ElnVertProp* lhs, const ElnVertProp* rhs) {
                     if (opt_::ALGORITHM == opt_::Algorithm::ASTAR)
                       return lhs->sort_score < rhs->sort_score;
                     else return lhs->sort_score > rhs->sort_score;
                   });
  
  for (unsigned int i = 0; i < sortedUniques.size(); ++i)
    possibleLocations_[i] = sortedUniques[i]->id;
}